

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AlignmentQueryCase::iterate(AlignmentQueryCase *this)

{
  TestLog *log;
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_99;
  CallLogWrapper gl;
  string local_80;
  ResultCollector result;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_texture_buffer is not supported",
                 "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
                 ,0xbf);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector(&result,log,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  gl.m_enableLog = true;
  deqp::gls::StateQueryUtil::verifyStateIntegerMax
            (&result,&gl,this->m_target,this->m_maxValue,this->m_type);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

AlignmentQueryCase::IterateResult AlignmentQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);
	verifyStateIntegerMax(result, gl, m_target, m_maxValue, m_type);

	result.setTestContextResult(m_testCtx);
	return STOP;
}